

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xml_document::reset(xml_document *this)

{
  _destroy(this);
  _create(this);
  return;
}

Assistant:

PUGI_IMPL_FN void xml_document::reset()
	{
		_destroy();
		_create();
	}